

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_utils.h
# Opt level: O3

void crnlib::utils::endian_swap_mem(void *p,uint size_in_bytes,uint type_size)

{
  ushort *puVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  
  if (type_size == 8) {
    if (7 < size_in_bytes) {
      lVar4 = 0;
      do {
        uVar3 = *(ulong *)((long)p + lVar4 * 8);
        *(ulong *)((long)p + lVar4 * 8) =
             uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
             (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
             (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
        lVar4 = lVar4 + 1;
      } while (size_in_bytes >> 3 != (uint)lVar4);
    }
  }
  else if (type_size == 4) {
    if (3 < size_in_bytes) {
      lVar4 = 0;
      do {
        uVar2 = *(uint *)((long)p + lVar4 * 4);
        *(uint *)((long)p + lVar4 * 4) =
             uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
        lVar4 = lVar4 + 1;
      } while (size_in_bytes >> 2 != (uint)lVar4);
    }
  }
  else if ((type_size == 2) && (1 < size_in_bytes)) {
    lVar4 = 0;
    do {
      puVar1 = (ushort *)((long)p + lVar4 * 2);
      *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
      lVar4 = lVar4 + 1;
    } while (size_in_bytes >> 1 != (uint)lVar4);
  }
  return;
}

Assistant:

inline void endian_swap_mem(void* p, uint size_in_bytes, uint type_size) {
  switch (type_size) {
    case sizeof(uint16):
      endian_swap_mem16(static_cast<uint16*>(p), size_in_bytes / type_size);
      break;
    case sizeof(uint32):
      endian_swap_mem32(static_cast<uint32*>(p), size_in_bytes / type_size);
      break;
    case sizeof(uint64):
      endian_swap_mem64(static_cast<uint64*>(p), size_in_bytes / type_size);
      break;
  }
}